

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

void spherical_harmonic_values
               (int *n_data,int *l,int *m,double *theta,double *phi,double *yr,double *yi)

{
  int iVar1;
  long lVar2;
  double dVar3;
  
  if (*n_data < 0) {
    *n_data = 0;
  }
  iVar1 = *n_data;
  *n_data = iVar1 + 1;
  if ((long)iVar1 < 0x14) {
    *l = *(int *)(&DAT_0022b610 + (long)iVar1 * 4);
    *m = *(int *)(&DAT_0022b65c + (long)*n_data * 4);
    lVar2 = (long)*n_data;
    *theta = *(double *)(&DAT_0022b748 + lVar2 * 8);
    *phi = *(double *)(&DAT_0022b6a8 + lVar2 * 8);
    *yr = *(double *)(&DAT_0022b888 + lVar2 * 8);
    dVar3 = *(double *)(&DAT_0022b7e8 + lVar2 * 8);
  }
  else {
    *n_data = 0;
    *l = 0;
    *m = 0;
    *theta = 0.0;
    *phi = 0.0;
    *yr = 0.0;
    dVar3 = 0.0;
  }
  *yi = dVar3;
  return;
}

Assistant:

void spherical_harmonic_values ( int *n_data, int *l, int *m, double *theta,
  double *phi, double *yr, double *yi ) 

//****************************************************************************80
//
//  Purpose:
//
//    SPHERICAL_HARMONIC_VALUES returns values of spherical harmonic functions.
//
//  Discussion:
//
//    In Mathematica, the function can be evaluated by
//
//      SphericalHarmonicY [ l, m, theta, phi ]
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 March 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Eric Weisstein,
//    CRC Concise Encyclopedia of Mathematics,
//    CRC Press, 2002,
//    Second edition,
//    ISBN: 1584883472,
//    LC: QA5.W45.
//
//    Stephen Wolfram,
//    The Mathematica Book,
//    Fourth Edition,
//    Cambridge University Press, 1999,
//    ISBN: 0-521-64314-7,
//    LC: QA76.95.W65.
//
//  Parameters:
//
//    Input/output, int *N_DATA.  The user sets N_DATA to 0 before the
//    first call.  On each call, the routine increments N_DATA by 1, and
//    returns the corresponding data; when there is no more data, the
//    output value of N_DATA will be 0 again.
//
//    Output, int *L, int *M, double THETA, PHI, the arguments
//    of the function.
//
//    Output, double *YR, *YI, the real and imaginary parts of
//    the function.
//
{
# define N_MAX 20

  int l_vec[N_MAX] = {
     0,  1,  2,  
     3,  4,  5,  
     5,  5,  5,  
     5,  4,  4,  
     4,  4,  4,  
     3,  3,  3,  
     3,  3 };
  int m_vec[N_MAX] = {
     0,  0,  1,  
     2,  3,  5,  
     4,  3,  2,  
     1,  2,  2,  
     2,  2,  2,  
    -1, -1, -1,  
    -1, -1 };
  double phi_vec[N_MAX] = {
    0.1047197551196598E+01, 0.1047197551196598E+01, 0.1047197551196598E+01, 
    0.1047197551196598E+01, 0.1047197551196598E+01, 0.6283185307179586, 
    0.6283185307179586, 0.6283185307179586, 0.6283185307179586, 
    0.6283185307179586, 0.7853981633974483, 0.7853981633974483, 
    0.7853981633974483, 0.7853981633974483, 0.7853981633974483, 
    0.4487989505128276, 0.8975979010256552, 0.1346396851538483E+01, 
    0.1795195802051310E+01, 0.2243994752564138E+01 };
  double theta_vec[N_MAX] = {
    0.5235987755982989, 0.5235987755982989, 0.5235987755982989, 
    0.5235987755982989, 0.5235987755982989, 0.2617993877991494, 
    0.2617993877991494, 0.2617993877991494, 0.2617993877991494, 
    0.2617993877991494, 0.6283185307179586, 0.1884955592153876E+01, 
    0.3141592653589793E+01, 0.4398229715025711E+01, 0.5654866776461628E+01, 
    0.3926990816987242, 0.3926990816987242, 0.3926990816987242, 
    0.3926990816987242, 0.3926990816987242 };
  double yi_vec[N_MAX] = {
    0.0000000000000000,  0.0000000000000000, -0.2897056515173922, 
    0.1916222768312404,  0.0000000000000000,  0.0000000000000000, 
    0.3739289485283311E-02, -0.4219517552320796E-01,  0.1876264225575173, 
   -0.3029973424491321,  0.4139385503112256, -0.1003229830187463, 
    0.0000000000000000, -0.1003229830187463,  0.4139385503112256, 
   -0.1753512375142586, -0.3159720118970196, -0.3940106541811563, 
   -0.3940106541811563, -0.3159720118970196 };
  double yr_vec[N_MAX] = {
   0.2820947917738781,  0.4231421876608172, -0.1672616358893223, 
  -0.1106331731112457,  0.1354974113737760,  0.5390423109043568E-03, 
  -0.5146690442951909E-02,  0.1371004361349490E-01,  0.6096352022265540E-01, 
  -0.4170400640977983,  0.0000000000000000,  0.0000000000000000, 
   0.0000000000000000,  0.0000000000000000,  0.0000000000000000, 
   0.3641205966137958,  0.2519792711195075,  0.8993036065704300E-01, 
  -0.8993036065704300E-01, -0.2519792711195075 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  *n_data = *n_data + 1;

  if ( N_MAX < *n_data )
  {
    *n_data = 0;
    *l = 0;
    *m = 0;
    *theta = 0.0;
    *phi = 0.0;
    *yr = 0.0;
    *yi = 0.0;
  }
  else
  {
    *l = l_vec[*n_data-1];
    *m = m_vec[*n_data-1];
    *theta = theta_vec[*n_data-1];
    *phi = phi_vec[*n_data-1];
    *yr = yr_vec[*n_data-1];
    *yi = yi_vec[*n_data-1];
  }

  return;
# undef N_MAX
}